

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O1

char * ecs_module_path_from_c(char *c_name)

{
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  ecs_strbuf_t str;
  char local_471;
  ecs_strbuf_t local_470;
  
  memset(&local_470,0,0x440);
  cVar5 = *c_name;
  local_471 = cVar5;
  if (cVar5 != '\0') {
    lVar4 = 0;
    ppuVar1 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)cVar5 * 2 + 1) & 1) != 0) {
        pp_Var2 = __ctype_tolower_loc();
        local_471 = ecs_to_i8((long)(*pp_Var2)[cVar5]);
        if (lVar4 != 0) {
          ecs_strbuf_appendstrn(&local_470,".",1);
        }
      }
      ecs_strbuf_appendstrn(&local_470,&local_471,1);
      cVar5 = c_name[lVar4 + 1];
      lVar4 = lVar4 + 1;
      local_471 = cVar5;
    } while (cVar5 != '\0');
  }
  pcVar3 = ecs_strbuf_get(&local_470);
  return pcVar3;
}

Assistant:

char* ecs_module_path_from_c(
    const char *c_name)
{
    ecs_strbuf_t str = ECS_STRBUF_INIT;
    const char *ptr;
    char ch;

    for (ptr = c_name; (ch = *ptr); ptr++) {
        if (isupper(ch)) {
            ch = ecs_to_i8(tolower(ch));
            if (ptr != c_name) {
                ecs_strbuf_appendstrn(&str, ".", 1);
            }
        }

        ecs_strbuf_appendstrn(&str, &ch, 1);
    }

    return ecs_strbuf_get(&str);
}